

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O3

void __thiscall cursespp::AppLayout::FocusShortcuts(AppLayout *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  (*(((this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x2b])();
  (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x44])
            (this);
  (*(((this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[7])();
  peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3a])(&local_28);
    p_Var3 = p_Stack_20;
    peVar2 = local_28;
    local_28 = (element_type *)0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar2;
    (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var3;
    if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
       p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
    (*(((this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3b])();
  }
  (*(((this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[7])();
  return;
}

Assistant:

void AppLayout::FocusShortcuts() {
    this->shortcuts->Show();
    this->Layout();
    this->shortcuts->Focus();

    if (this->layout) {
        this->lastFocus = this->layout->GetFocus();
        this->layout->SetFocus(IWindowPtr());
    }

    this->shortcuts->Focus();
}